

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

AllocatedBlock * __thiscall ctemplate::BaseArena::IndexToBlock(BaseArena *this,int index)

{
  int iVar1;
  size_type sVar2;
  int index_in_overflow_blocks;
  int index_local;
  BaseArena *this_local;
  
  if ((uint)index < 0x10) {
    this_local = (BaseArena *)(this->first_blocks_ + index);
  }
  else {
    if (this->overflow_blocks_ ==
        (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
         *)0x0) {
      fprintf(_stderr,"Check failed: %s\n","overflow_blocks_ != NULL");
      exit(1);
    }
    iVar1 = index + -0x10;
    if (iVar1 < 0) {
      fprintf(_stderr,"Check failed: %s %s %s\n","index_in_overflow_blocks",">=","0");
      exit(1);
    }
    sVar2 = std::
            vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
            ::size(this->overflow_blocks_);
    if (sVar2 <= (ulong)(long)iVar1) {
      fprintf(_stderr,"Check failed: %s %s %s\n","static_cast<size_t>(index_in_overflow_blocks)","<"
              ,"overflow_blocks_->size()");
      exit(1);
    }
    this_local = (BaseArena *)
                 std::
                 vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                 ::operator[](this->overflow_blocks_,(long)iVar1);
  }
  return (AllocatedBlock *)this_local;
}

Assistant:

const BaseArena::AllocatedBlock *BaseArena::IndexToBlock(int index) const {
  if (index < ARRAYSIZE(first_blocks_)) {
    return &first_blocks_[index];
  }
  CHECK(overflow_blocks_ != NULL);
  int index_in_overflow_blocks = index - ARRAYSIZE(first_blocks_);
  CHECK_GE(index_in_overflow_blocks, 0);
  CHECK_LT(static_cast<size_t>(index_in_overflow_blocks),
           overflow_blocks_->size());
  return &(*overflow_blocks_)[index_in_overflow_blocks];
}